

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ResizeBilinearLayerParams::ByteSizeLong(ResizeBilinearLayerParams *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  size_t total_size;
  ResizeBilinearLayerParams *this_local;
  
  data_size = 0;
  sVar3 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->targetsize_);
  if (sVar3 != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar3);
    data_size = sVar4 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar3);
  this->_targetsize_cached_byte_size_ = iVar2;
  data_size = sVar3 + data_size;
  bVar1 = has_mode(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SamplingMode>(this->mode_);
    data_size = sVar3 + 1 + data_size;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(data_size);
  this->_cached_size_ = iVar2;
  return data_size;
}

Assistant:

size_t ResizeBilinearLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ResizeBilinearLayerParams)
  size_t total_size = 0;

  // repeated uint64 targetSize = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->targetsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _targetsize_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.SamplingMode mode = 2;
  if (this->has_mode()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->mode_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}